

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.h
# Opt level: O0

void __thiscall
cali::Preprocessor::operator()
          (Preprocessor *this,CaliperMetadataAccessInterface *db,EntryList *rec,
          SnapshotProcessFn *push)

{
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_40;
  SnapshotProcessFn *local_28;
  SnapshotProcessFn *push_local;
  EntryList *rec_local;
  CaliperMetadataAccessInterface *db_local;
  Preprocessor *this_local;
  
  local_28 = push;
  push_local = (SnapshotProcessFn *)rec;
  rec_local = (EntryList *)db;
  db_local = (CaliperMetadataAccessInterface *)this;
  cali::Preprocessor::process((CaliperMetadataAccessInterface *)&local_40,(vector *)this);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::operator()(push,db,&local_40);
  std::vector<cali::Entry,_std::allocator<cali::Entry>_>::~vector(&local_40);
  return;
}

Assistant:

void operator() (CaliperMetadataAccessInterface& db, const EntryList& rec, SnapshotProcessFn push)
    {
        push(db, process(db, rec));
    }